

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall iutest::detail::IParamTestSuiteInfo::RegisterTests(IParamTestSuiteInfo *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = *(undefined8 **)(this + 0x10);
  for (puVar2 = *(undefined8 **)(this + 8); puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (**(code **)(*(long *)this + 0x10))(this,*puVar2);
  }
  return;
}

Assistant:

void RegisterTests() const
    {
        for( TestInfoContainer::const_iterator it=m_testinfos.begin(), end=m_testinfos.end(); it != end; ++it )
        {
            OnRegisterTests(*it);
        }
    }